

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O1

void __thiscall nuraft::asio_service_impl::worker_entry(asio_service_impl *this)

{
  atomic<unsigned_int> *paVar1;
  uint __val;
  element_type *peVar2;
  char cVar3;
  char cVar4;
  bool bVar5;
  int iVar6;
  long *plVar7;
  pthread_t __target_thread;
  error_category *peVar8;
  long *plVar9;
  uint uVar10;
  error_code __ec;
  string thread_name;
  string __str;
  string local_a0;
  error_code local_80;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  char *local_50;
  uint local_48;
  char local_40 [16];
  
  cVar4 = '\x01';
  LOCK();
  paVar1 = &this->worker_id_;
  __val = (paVar1->super___atomic_base<unsigned_int>)._M_i;
  (paVar1->super___atomic_base<unsigned_int>)._M_i =
       (paVar1->super___atomic_base<unsigned_int>)._M_i + 1;
  UNLOCK();
  if (9 < __val) {
    uVar10 = __val;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (uVar10 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_0019bb0b;
      }
      if (uVar10 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_0019bb0b;
      }
      if (uVar10 < 10000) goto LAB_0019bb0b;
      bVar5 = 99999 < uVar10;
      uVar10 = uVar10 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar5);
    cVar4 = cVar4 + '\x01';
  }
LAB_0019bb0b:
  local_50 = local_40;
  std::__cxx11::string::_M_construct((ulong)&local_50,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>(local_50,local_48,__val);
  plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x201223);
  local_70 = &local_60;
  plVar9 = plVar7 + 2;
  if ((long *)*plVar7 == plVar9) {
    local_60 = *plVar9;
    lStack_58 = plVar7[3];
  }
  else {
    local_60 = *plVar9;
    local_70 = (long *)*plVar7;
  }
  local_68 = plVar7[1];
  *plVar7 = (long)plVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  __target_thread = pthread_self();
  pthread_setname_np(__target_thread,(char *)local_70);
  if ((this->my_opt_).worker_start_.super__Function_base._M_manager != (_Manager_type)0x0) {
    local_50 = (char *)CONCAT44(local_50._4_4_,__val);
    (*(this->my_opt_).worker_start_._M_invoker)
              ((_Any_data *)&(this->my_opt_).worker_start_,(uint *)&local_50);
  }
  if (worker_entry()::timer == '\0') {
    iVar6 = __cxa_guard_acquire(&worker_entry()::timer);
    if (iVar6 != 0) {
      worker_entry::timer.t_created_.__d.__r = (duration)0;
      worker_entry::timer.duration_us_ = 60000000;
      worker_entry::timer.first_event_fired_ = true;
      worker_entry::timer.lock_.super___mutex_base._M_mutex.__align = 0;
      worker_entry::timer.lock_.super___mutex_base._M_mutex._8_8_ = 0;
      worker_entry::timer.lock_.super___mutex_base._M_mutex._16_8_ = 0;
      worker_entry::timer.lock_.super___mutex_base._M_mutex.__data.__list.__prev =
           (__pthread_internal_list *)0x0;
      worker_entry::timer.lock_.super___mutex_base._M_mutex.__data.__list.__next =
           (__pthread_internal_list *)0x0;
      timer_helper::reset(&worker_entry::timer);
      __cxa_guard_release(&worker_entry()::timer);
    }
  }
  peVar8 = (error_category *)std::_V2::system_category();
  do {
    LOCK();
    (this->num_active_workers_).super___atomic_base<unsigned_int>._M_i =
         (this->num_active_workers_).super___atomic_base<unsigned_int>._M_i + 1;
    UNLOCK();
    local_80._M_value = 0;
    local_80._M_cat = peVar8;
    asio::detail::scheduler::run((this->io_svc_).impl_,&local_80);
    __ec._4_4_ = 0;
    __ec._M_value = local_80._M_value;
    if (local_80._M_value != 0) {
      __ec._M_cat = local_80._M_cat;
      std::system_error::system_error((system_error *)&local_50,__ec);
      asio::detail::throw_exception<std::system_error>((system_error *)&local_50);
      std::system_error::~system_error((system_error *)&local_50);
    }
    LOCK();
    (this->num_active_workers_).super___atomic_base<unsigned_int>._M_i =
         (this->num_active_workers_).super___atomic_base<unsigned_int>._M_i - 1;
    UNLOCK();
    bVar5 = timer_helper::timeout_and_reset(&worker_entry::timer);
    if (bVar5) {
      LOCK();
      worker_entry::exception_count.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)0;
      UNLOCK();
    }
    else if (10 < (ulong)worker_entry::exception_count.super___atomic_base<unsigned_long>._M_i) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar2 != (element_type *)0x0) {
        iVar6 = (**(code **)(*(long *)peVar2 + 0x38))();
        if (0 < iVar6) {
          peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_
                    (&local_a0,"too many exceptions (%zu) in 1-min time window.",
                     worker_entry::exception_count.super___atomic_base<unsigned_long>._M_i);
          (**(code **)(*(long *)peVar2 + 0x40))
                    (peVar2,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
                     ,"worker_entry",0x719,&local_a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_a0._M_dataplus._M_p._4_4_,(uint)local_a0._M_dataplus._M_p) !=
              &local_a0.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_a0._M_dataplus._M_p._4_4_,(uint)local_a0._M_dataplus._M_p
                                    ));
          }
        }
      }
      LOCK();
      worker_entry::exception_count.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)0;
      UNLOCK();
      abort();
    }
  } while ((this->stopping_status_).super___atomic_base<unsigned_char>._M_i != '\x01');
  if ((this->my_opt_).worker_stop_.super__Function_base._M_manager != (_Manager_type)0x0) {
    local_a0._M_dataplus._M_p._0_4_ = __val;
    (*(this->my_opt_).worker_stop_._M_invoker)
              ((_Any_data *)&(this->my_opt_).worker_stop_,(uint *)&local_a0);
  }
  peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar2 != (element_type *)0x0) {
    iVar6 = (**(code **)(*(long *)peVar2 + 0x38))();
    if (3 < iVar6) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                (&local_a0,"end of asio worker thread, remaining threads: %u",
                 (ulong)(this->num_active_workers_).super___atomic_base<unsigned_int>._M_i);
      (**(code **)(*(long *)peVar2 + 0x40))
                (peVar2,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
                 ,"worker_entry",0x725,&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_a0._M_dataplus._M_p._4_4_,(uint)local_a0._M_dataplus._M_p) !=
          &local_a0.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_a0._M_dataplus._M_p._4_4_,(uint)local_a0._M_dataplus._M_p));
      }
    }
  }
  if (local_70 != &local_60) {
    operator_delete(local_70);
  }
  return;
}

Assistant:

void asio_service_impl::worker_entry() {
    uint32_t worker_id = worker_id_.fetch_add(1);
    std::string thread_name = "nuraft_w_" + std::to_string(worker_id);
#ifdef __linux__
    pthread_setname_np(pthread_self(), thread_name.c_str());
#elif __APPLE__
    pthread_setname_np(thread_name.c_str());
#endif

    if (my_opt_.worker_start_) {
        my_opt_.worker_start_(worker_id);
    }

    static std::atomic<size_t> exception_count(0);
    static timer_helper timer(60 * 1000000); // 1 min.
    const size_t MAX_COUNT = 10;

    do {
        try {
            num_active_workers_.fetch_add(1);
            io_svc_.run();
            num_active_workers_.fetch_sub(1);

        } catch (std::exception& ee) {
            // LCOV_EXCL_START
            num_active_workers_.fetch_sub(1);
            exception_count++;
            p_er("asio worker thread got exception: %s, "
                 "current number of workers: %u, "
                 "exception count (in 1-min window): %zu, "
                 "stopping status %u",
                 ee.what(),
                 num_active_workers_.load(),
                 exception_count.load(),
                 stopping_status_.load());
            // LCOV_EXCL_STOP
        }

        // LCOV_EXCL_START
        if (timer.timeout_and_reset()) {
            exception_count = 0;

        } else if (exception_count > MAX_COUNT) {
            p_ft("too many exceptions (%zu) in 1-min time window.",
                 exception_count.load());
            exception_count = 0;
            abort();
        }
        // LCOV_EXCL_STOP
    } while (stopping_status_ != 1);

    if (my_opt_.worker_stop_) {
        my_opt_.worker_stop_(worker_id);
    }

    p_in("end of asio worker thread, remaining threads: %u",
         num_active_workers_.load());
}